

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packets.c
# Opt level: O0

int rtr_send_error_pdu(rtr_socket *rtr_socket,void *erroneous_pdu,uint32_t erroneous_pdu_len,
                      pdu_error_type error,char *err_text,uint32_t err_text_len)

{
  long lVar1;
  uint len;
  char *__src;
  void *pvVar2;
  pdu_type pVar3;
  ulong uVar4;
  undefined1 *puVar5;
  long in_FS_OFFSET;
  undefined8 uStack_80;
  undefined1 auStack_78 [4];
  int local_74;
  undefined1 *local_70;
  undefined4 local_64;
  ulong local_60;
  unsigned_long __vla_expr0;
  uint local_4c;
  undefined1 *puStack_48;
  uint msg_size;
  pdu_error *err_pdu;
  char *pcStack_38;
  uint32_t err_text_len_local;
  char *err_text_local;
  pdu_error_type error_local;
  uint32_t erroneous_pdu_len_local;
  void *erroneous_pdu_local;
  rtr_socket *rtr_socket_local;
  long local_10;
  
  __vla_expr0 = (unsigned_long)auStack_78;
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_4c = erroneous_pdu_len + 0x10 + err_text_len;
  local_60 = (ulong)local_4c;
  lVar1 = -(local_60 + 0xf & 0xfffffffffffffff0);
  local_70 = auStack_78 + lVar1;
  puVar5 = auStack_78;
  err_pdu._4_4_ = err_text_len;
  pcStack_38 = err_text;
  err_text_local._0_4_ = error;
  err_text_local._4_4_ = erroneous_pdu_len;
  _error_local = erroneous_pdu;
  erroneous_pdu_local = rtr_socket;
  if (1 < erroneous_pdu_len) {
    *(undefined8 *)((long)&uStack_80 + lVar1) = 0x10e891;
    pVar3 = rtr_get_pdu_type(erroneous_pdu);
    puVar5 = (undefined1 *)__vla_expr0;
    if (pVar3 == ERROR) {
      *(undefined8 *)((long)&uStack_80 + lVar1) = 0x10e8a4;
      lrtr_dbg("RTR Socket: Don\'t send errors for erroneous error PDUs");
      rtr_socket_local._4_4_ = 0;
      goto LAB_0010e964;
    }
  }
  __vla_expr0 = (unsigned_long)puVar5;
  puStack_48 = local_70;
  *local_70 = (char)*(undefined4 *)((long)erroneous_pdu_local + 0x60);
  puStack_48[1] = 10;
  *(short *)(puStack_48 + 2) = (short)(pdu_error_type)err_text_local;
  *(uint *)(puStack_48 + 4) = local_4c;
  *(uint32_t *)(puStack_48 + 8) = err_text_local._4_4_;
  pvVar2 = _error_local;
  if (err_text_local._4_4_ != 0) {
    puVar5 = puStack_48 + 0xc;
    uVar4 = (ulong)err_text_local._4_4_;
    *(undefined8 *)((long)&uStack_80 + lVar1) = 0x10e916;
    memcpy(puVar5,pvVar2,uVar4);
  }
  __src = pcStack_38;
  *(uint32_t *)(puStack_48 + (ulong)err_text_local._4_4_ + 0xc) = err_pdu._4_4_;
  if (err_pdu._4_4_ != 0) {
    puVar5 = puStack_48 + (ulong)err_text_local._4_4_ + 0x10;
    uVar4 = (ulong)err_pdu._4_4_;
    *(undefined8 *)((long)&uStack_80 + lVar1) = 0x10e94a;
    memcpy(puVar5,__src,uVar4);
  }
  pvVar2 = erroneous_pdu_local;
  len = local_4c;
  puVar5 = local_70;
  *(undefined8 *)((long)&uStack_80 + lVar1) = 0x10e95a;
  rtr_socket_local._4_4_ = rtr_send_pdu((rtr_socket *)pvVar2,puVar5,len);
LAB_0010e964:
  local_64 = 1;
  local_74 = rtr_socket_local._4_4_;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    *(code **)(__vla_expr0 - 8) = recv_loop_cleanup;
    __stack_chk_fail();
  }
  return rtr_socket_local._4_4_;
}

Assistant:

static int rtr_send_error_pdu(const struct rtr_socket *rtr_socket, const void *erroneous_pdu,
			      const uint32_t erroneous_pdu_len, const enum pdu_error_type error, const char *err_text,
			      const uint32_t err_text_len)
{
	struct pdu_error *err_pdu;
	unsigned int msg_size = sizeof(struct pdu_error) + 4 + erroneous_pdu_len + err_text_len;
	uint8_t msg[msg_size];

	// don't send errors for erroneous error PDUs
	if (erroneous_pdu_len >= 2) {
		if (rtr_get_pdu_type(erroneous_pdu) == ERROR) {
			RTR_DBG1("Don't send errors for erroneous error PDUs");
			return RTR_SUCCESS;
		}
	}

	err_pdu = (struct pdu_error *)msg;
	err_pdu->ver = rtr_socket->version;
	err_pdu->type = ERROR;
	err_pdu->error_code = error;
	err_pdu->len = msg_size;

	err_pdu->len_enc_pdu = erroneous_pdu_len;
	if (erroneous_pdu_len > 0)
		memcpy(err_pdu->rest, erroneous_pdu, erroneous_pdu_len);

	*((uint32_t *)(err_pdu->rest + erroneous_pdu_len)) = err_text_len;
	if (err_text_len > 0)
		memcpy(err_pdu->rest + erroneous_pdu_len + 4, err_text, err_text_len);

	return rtr_send_pdu(rtr_socket, msg, msg_size);
}